

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSteerDemo.cpp
# Opt level: O1

void anon_unknown.dwarf_e4bb::reshape(GLFWwindow *window,int width,int height)

{
  (*glad_glViewport)(0,0,width,height);
  (*glad_glMatrixMode)(0x1701);
  (*glad_glLoadIdentity)();
  (*glad_glFrustum)(-0.5,0.5,(double)(((float)height / (float)width) * -0.5),
                    (double)(((float)height / (float)width) * 0.5),1.0,400.0);
  (*glad_glMatrixMode)(0x1700);
  return;
}

Assistant:

void reshape( GLFWwindow* window, int width, int height )
    {
      GLfloat h = (GLfloat) height / (GLfloat) width;
      GLfloat xmax, znear, zfar;

      znear = 1.0f;
      zfar  = 400.0f;
      xmax  = znear * 0.5f;

      glViewport( 0, 0, (GLint) width, (GLint) height );
      glMatrixMode( GL_PROJECTION );
      glLoadIdentity();
      glFrustum( -xmax, xmax, -xmax*h, xmax*h, znear, zfar );
      glMatrixMode( GL_MODELVIEW );
    }